

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void __thiscall polyscope::render::Engine::allocateGlobalBuffersAndPrograms(Engine *this)

{
  shared_ptr<polyscope::render::TextureBuffer> *this_00;
  shared_ptr<polyscope::render::TextureBuffer> *this_01;
  shared_ptr<polyscope::render::FrameBuffer> *this_02;
  undefined8 uVar1;
  element_type *peVar2;
  element_type *peVar3;
  long *plVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  allocator local_209;
  shared_ptr<polyscope::render::RenderBuffer> sceneColorAlt;
  __shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2> local_1e8;
  shared_ptr<polyscope::render::RenderBuffer> sceneDepthAlt;
  __shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  __shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2> local_180;
  __shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> local_160;
  __shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> local_140;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  (*this->_vptr_Engine[0x1f])
            ((__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt,this,4,(ulong)view::bufferWidth,(ulong)view::bufferHeight,0);
  this_00 = &this->sceneColor;
  std::__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->
              super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (*this->_vptr_Engine[0x1f])
            ((__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt,this,9,(ulong)view::bufferWidth,(ulong)view::bufferHeight,0);
  this_01 = &this->sceneDepth;
  std::__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_01->
              super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (*this->_vptr_Engine[0x22])
            ((__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt,this,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  std::__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->sceneBuffer).
              super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar2 = (this->sceneBuffer).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_140,
             &this_00->
              super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>);
  (*peVar2->_vptr_FrameBuffer[6])(peVar2,&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140._M_refcount);
  peVar2 = (this->sceneBuffer).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_150,
             &this_01->
              super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>);
  (*peVar2->_vptr_FrameBuffer[8])(peVar2,&local_150);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150._M_refcount);
  (*((this->sceneBuffer).
     super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_FrameBuffer[9])();
  auVar6._8_4_ = 0x3f800000;
  auVar6._0_8_ = 0x3f8000003f800000;
  auVar6._12_4_ = 0x3f800000;
  peVar2 = (this->sceneBuffer).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = vmovlps_avx(auVar6);
  (peVar2->clearColor).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
  (peVar2->clearColor).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar1 >> 0x20);
  (peVar2->clearColor).field_2.z = 1.0;
  ((this->sceneBuffer).
   super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  clearAlpha = 0.0;
  (*this->_vptr_Engine[0x1f])
            ((__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt,this,9,(ulong)view::bufferWidth,(ulong)view::bufferHeight,0);
  std::__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->sceneDepthMin).
              super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (*this->_vptr_Engine[0x22])
            ((__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt,this,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  std::__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->sceneDepthMinFrame).
              super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar2 = (this->sceneDepthMinFrame).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_160,
             &(this->sceneDepthMin).
              super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>);
  (*peVar2->_vptr_FrameBuffer[8])(peVar2,&local_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount);
  ((this->sceneDepthMinFrame).
   super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  clearDepth = 0.0;
  (*this->_vptr_Engine[0x1f])
            ((__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt,this,4,(ulong)view::bufferWidth,(ulong)view::bufferHeight,0);
  std::__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->sceneColorFinal).
              super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (*this->_vptr_Engine[0x22])
            ((__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt,this,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  std::__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->sceneBufferFinal).
              super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar2 = (this->sceneBufferFinal).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_170,
             &(this->sceneColorFinal).
              super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>);
  (*peVar2->_vptr_FrameBuffer[6])(peVar2,&local_170);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170._M_refcount);
  (*((this->sceneBufferFinal).
     super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_FrameBuffer[9])();
  auVar7._8_4_ = 0x3f800000;
  auVar7._0_8_ = 0x3f8000003f800000;
  auVar7._12_4_ = 0x3f800000;
  peVar2 = (this->sceneBufferFinal).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = vmovlps_avx(auVar7);
  (peVar2->clearColor).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
  (peVar2->clearColor).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar1 >> 0x20);
  (peVar2->clearColor).field_2.z = 1.0;
  ((this->sceneBufferFinal).
   super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  clearAlpha = 0.0;
  (*this->_vptr_Engine[0x21])
            (&sceneColorAlt,this,1,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  (*this->_vptr_Engine[0x21])
            (&sceneDepthAlt,this,2,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  (*this->_vptr_Engine[0x22])(&local_1e8,this,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  this_02 = &this->displayBufferAlt;
  std::__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_02->
              super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>,
             &local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
  peVar2 = (this->displayBufferAlt).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_180,
             &sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>);
  (*peVar2->_vptr_FrameBuffer[5])(peVar2,&local_180);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180._M_refcount);
  peVar2 = (this_02->super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  std::__shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_190,
             &sceneDepthAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>);
  (*peVar2->_vptr_FrameBuffer[7])(peVar2,&local_190);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
  (*((this_02->super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr)->_vptr_FrameBuffer[9])();
  auVar8._8_4_ = 0x3f800000;
  auVar8._0_8_ = 0x3f8000003f800000;
  auVar8._12_4_ = 0x3f800000;
  peVar2 = (this->displayBufferAlt).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = vmovlps_avx(auVar8);
  (peVar2->clearColor).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
  (peVar2->clearColor).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar1 >> 0x20);
  (peVar2->clearColor).field_2.z = 1.0;
  ((this->displayBufferAlt).
   super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  clearAlpha = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sceneDepthAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (*this->_vptr_Engine[0x21])
            (&sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>,this,3
             ,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  std::__shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->pickColorBuffer).
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>,
             &sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (*this->_vptr_Engine[0x21])
            (&sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>,this,2
             ,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  std::__shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->pickDepthBuffer).
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>,
             &sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (*this->_vptr_Engine[0x22])
            ((__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt,this,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  std::__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->pickFramebuffer).
              super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2> *)
             &sceneColorAlt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sceneColorAlt.
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar2 = (this->pickFramebuffer).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1a0,
             &(this->pickColorBuffer).
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>);
  (*peVar2->_vptr_FrameBuffer[5])(peVar2,&local_1a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0._M_refcount);
  peVar2 = (this->pickFramebuffer).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1b0,
             &(this->pickDepthBuffer).
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>);
  (*peVar2->_vptr_FrameBuffer[7])(peVar2,&local_1b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount);
  (*((this->pickFramebuffer).
     super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_FrameBuffer[9])();
  (*this->_vptr_Engine[0x11])(this,1);
  plVar4 = engine;
  std::__cxx11::string::string((string *)&sceneColorAlt,"TEXTURE_DRAW_PLAIN",&local_209);
  sceneDepthAlt.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  sceneDepthAlt.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (**(code **)(*plVar4 + 0x118))(&local_1e8,plVar4,&sceneColorAlt);
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->renderTexturePlain).
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)
             &local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sceneDepthAlt);
  std::__cxx11::string::~string((string *)&sceneColorAlt);
  peVar3 = (this->renderTexturePlain).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar5 = "a_position";
  std::__cxx11::string::string(local_50,"a_position",(allocator *)&sceneDepthAlt);
  screenTrianglesCoords
            ((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&sceneColorAlt,(Engine *)pcVar5);
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_50,&sceneColorAlt,0,0,0xffffffffffffffff);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base((_Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)&sceneColorAlt);
  std::__cxx11::string::~string(local_50);
  plVar4 = engine;
  std::__cxx11::string::string((string *)&sceneColorAlt,"TEXTURE_DRAW_DOT3",&local_209);
  sceneDepthAlt.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  sceneDepthAlt.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (**(code **)(*plVar4 + 0x118))(&local_1e8,plVar4,&sceneColorAlt);
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->renderTextureDot3).
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)
             &local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sceneDepthAlt);
  std::__cxx11::string::~string((string *)&sceneColorAlt);
  peVar3 = (this->renderTextureDot3).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar5 = "a_position";
  std::__cxx11::string::string(local_70,"a_position",(allocator *)&sceneDepthAlt);
  screenTrianglesCoords
            ((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&sceneColorAlt,(Engine *)pcVar5);
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_70,&sceneColorAlt,0,0,0xffffffffffffffff);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base((_Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)&sceneColorAlt);
  std::__cxx11::string::~string(local_70);
  plVar4 = engine;
  std::__cxx11::string::string((string *)&sceneColorAlt,"TEXTURE_DRAW_MAP3",&local_209);
  sceneDepthAlt.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  sceneDepthAlt.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (**(code **)(*plVar4 + 0x118))(&local_1e8,plVar4,&sceneColorAlt);
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->renderTextureMap3).
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)
             &local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sceneDepthAlt);
  std::__cxx11::string::~string((string *)&sceneColorAlt);
  peVar3 = (this->renderTextureMap3).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar5 = "a_position";
  std::__cxx11::string::string(local_90,"a_position",(allocator *)&sceneDepthAlt);
  screenTrianglesCoords
            ((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&sceneColorAlt,(Engine *)pcVar5);
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_90,&sceneColorAlt,0,0,0xffffffffffffffff);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base((_Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)&sceneColorAlt);
  std::__cxx11::string::~string(local_90);
  plVar4 = engine;
  std::__cxx11::string::string((string *)&sceneColorAlt,"TEXTURE_DRAW_SPHEREBG",&local_209);
  sceneDepthAlt.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  sceneDepthAlt.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (**(code **)(*plVar4 + 0x118))(&local_1e8,plVar4,&sceneColorAlt,&sceneDepthAlt,2);
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->renderTextureSphereBG).
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)
             &local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sceneDepthAlt);
  std::__cxx11::string::~string((string *)&sceneColorAlt);
  peVar3 = (this->renderTextureSphereBG).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar5 = "a_position";
  std::__cxx11::string::string(local_b0,"a_position",(allocator *)&sceneDepthAlt);
  distantCubeCoords((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                     *)&sceneColorAlt,(Engine *)pcVar5);
  (*peVar3->_vptr_ShaderProgram[0x11])(peVar3,local_b0,&sceneColorAlt,0,0,0xffffffffffffffff);
  std::
  _Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base((_Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                   *)&sceneColorAlt);
  std::__cxx11::string::~string(local_b0);
  plVar4 = engine;
  std::__cxx11::string::string((string *)&sceneColorAlt,"COMPOSITE_PEEL",&local_209);
  sceneDepthAlt.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  sceneDepthAlt.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (**(code **)(*plVar4 + 0x118))(&local_1e8,plVar4,&sceneColorAlt,&sceneDepthAlt,2);
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->compositePeel).
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)
             &local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sceneDepthAlt);
  std::__cxx11::string::~string((string *)&sceneColorAlt);
  peVar3 = (this->compositePeel).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar5 = "a_position";
  std::__cxx11::string::string(local_d0,"a_position",(allocator *)&sceneDepthAlt);
  screenTrianglesCoords
            ((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&sceneColorAlt,(Engine *)pcVar5);
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_d0,&sceneColorAlt,0,0,0xffffffffffffffff);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base((_Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)&sceneColorAlt);
  std::__cxx11::string::~string(local_d0);
  peVar3 = (this->compositePeel).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string(local_f0,"t_image",(allocator *)&sceneColorAlt);
  (*peVar3->_vptr_ShaderProgram[0x1a])
            (peVar3,local_f0,
             (this_00->
             super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  std::__cxx11::string::~string(local_f0);
  plVar4 = engine;
  std::__cxx11::string::string((string *)&sceneColorAlt,"DEPTH_COPY",&local_209);
  sceneDepthAlt.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  sceneDepthAlt.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (**(code **)(*plVar4 + 0x118))(&local_1e8,plVar4,&sceneColorAlt);
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->copyDepth).
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)
             &local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sceneDepthAlt);
  std::__cxx11::string::~string((string *)&sceneColorAlt);
  peVar3 = (this->copyDepth).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar5 = "a_position";
  std::__cxx11::string::string(local_110,"a_position",(allocator *)&sceneDepthAlt);
  screenTrianglesCoords
            ((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&sceneColorAlt,(Engine *)pcVar5);
  (*peVar3->_vptr_ShaderProgram[0x10])(peVar3,local_110,&sceneColorAlt,0,0,0xffffffffffffffff);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base((_Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)&sceneColorAlt);
  std::__cxx11::string::~string(local_110);
  peVar3 = (this->copyDepth).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string(local_130,"t_depth",(allocator *)&sceneColorAlt);
  (*peVar3->_vptr_ShaderProgram[0x1a])
            (peVar3,local_130,
             (this_01->
             super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  std::__cxx11::string::~string(local_130);
  loadDefaultMaterials(this);
  loadDefaultColorMaps(this);
  return;
}

Assistant:

void Engine::allocateGlobalBuffersAndPrograms() {

  // Note: The display frame buffer should be manually wrapped by child classes

  { // Scene buffer

    // Note that this is basically duplicated in ground_plane.cpp, changes here should probably be reflected there
    sceneColor = generateTextureBuffer(TextureFormat::RGBA16F, view::bufferWidth, view::bufferHeight);
    // sceneDepth = generateRenderBuffer(RenderBufferType::Depth, view::bufferWidth, view::bufferHeight);
    sceneDepth = generateTextureBuffer(TextureFormat::DEPTH24, view::bufferWidth, view::bufferHeight);

    sceneBuffer = generateFrameBuffer(view::bufferWidth, view::bufferHeight);
    sceneBuffer->addColorBuffer(sceneColor);
    sceneBuffer->addDepthBuffer(sceneDepth);
    sceneBuffer->setDrawBuffers();

    sceneBuffer->clearColor = glm::vec3{1., 1., 1.};
    sceneBuffer->clearAlpha = 0.0;
  }

  { // Alternate depth texture used for some effects
    sceneDepthMin = generateTextureBuffer(TextureFormat::DEPTH24, view::bufferWidth, view::bufferHeight);

    sceneDepthMinFrame = generateFrameBuffer(view::bufferWidth, view::bufferHeight);
    sceneDepthMinFrame->addDepthBuffer(sceneDepthMin);
    sceneDepthMinFrame->clearDepth = 0.0;
  }

  { // "Final" scene buffer (after resolving)
    sceneColorFinal = generateTextureBuffer(TextureFormat::RGBA16F, view::bufferWidth, view::bufferHeight);

    sceneBufferFinal = generateFrameBuffer(view::bufferWidth, view::bufferHeight);
    sceneBufferFinal->addColorBuffer(sceneColorFinal);
    sceneBufferFinal->setDrawBuffers();

    sceneBufferFinal->clearColor = glm::vec3{1., 1., 1.};
    sceneBufferFinal->clearAlpha = 0.0;
  }

  { // Alternate display buffer
    std::shared_ptr<RenderBuffer> sceneColorAlt =
        generateRenderBuffer(RenderBufferType::ColorAlpha, view::bufferWidth, view::bufferHeight);
    std::shared_ptr<RenderBuffer> sceneDepthAlt =
        generateRenderBuffer(RenderBufferType::Depth, view::bufferWidth, view::bufferHeight);

    displayBufferAlt = generateFrameBuffer(view::bufferWidth, view::bufferHeight);
    displayBufferAlt->addColorBuffer(sceneColorAlt);
    displayBufferAlt->addDepthBuffer(sceneDepthAlt);
    displayBufferAlt->setDrawBuffers();

    displayBufferAlt->clearColor = glm::vec3{1., 1., 1.};
    displayBufferAlt->clearAlpha = 0.0;
  }

  { // Pick buffer
    pickColorBuffer = generateRenderBuffer(RenderBufferType::Float4, view::bufferWidth, view::bufferHeight);
    pickDepthBuffer = generateRenderBuffer(RenderBufferType::Depth, view::bufferWidth, view::bufferHeight);

    pickFramebuffer = generateFrameBuffer(view::bufferWidth, view::bufferHeight);
    pickFramebuffer->addColorBuffer(pickColorBuffer);
    pickFramebuffer->addDepthBuffer(pickDepthBuffer);
    pickFramebuffer->setDrawBuffers();
  }

  // Make sure all the buffer sizes are up to date
  updateWindowSize(true);

  { // Generate the general-use programs
    // clang-format off
    renderTexturePlain = render::engine->requestShader("TEXTURE_DRAW_PLAIN", {}, render::ShaderReplacementDefaults::Process);
    renderTexturePlain->setAttribute("a_position", screenTrianglesCoords());

    renderTextureDot3 = render::engine->requestShader("TEXTURE_DRAW_DOT3", {}, render::ShaderReplacementDefaults::Process);
    renderTextureDot3->setAttribute("a_position", screenTrianglesCoords());

    renderTextureMap3 = render::engine->requestShader("TEXTURE_DRAW_MAP3", {}, render::ShaderReplacementDefaults::Process);
    renderTextureMap3->setAttribute("a_position", screenTrianglesCoords());

    renderTextureSphereBG = render::engine->requestShader("TEXTURE_DRAW_SPHEREBG", {}, render::ShaderReplacementDefaults::Process);
    renderTextureSphereBG->setAttribute("a_position", distantCubeCoords());

    compositePeel = render::engine->requestShader("COMPOSITE_PEEL", {}, render::ShaderReplacementDefaults::Process);
    compositePeel->setAttribute("a_position", screenTrianglesCoords());
    compositePeel->setTextureFromBuffer("t_image", sceneColor.get());

    copyDepth = render::engine->requestShader("DEPTH_COPY", {}, render::ShaderReplacementDefaults::Process);
    copyDepth->setAttribute("a_position", screenTrianglesCoords());
    copyDepth->setTextureFromBuffer("t_depth", sceneDepth.get());
    // clang-format on
  }

  { // Load defaults
    loadDefaultMaterials();
    loadDefaultColorMaps();
  }
}